

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Thing_Deactivate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                       int arg4)

{
  AActor *pAVar1;
  AActor *thing;
  AActor *thing_00;
  
  if (arg0 == 0) {
    thing_00 = it;
    if (it == (AActor *)0x0) {
      return 0;
    }
  }
  else {
    pAVar1 = AActor::TIDHash[arg0 & 0x7f];
    do {
      thing_00 = pAVar1;
      if (thing_00 == (AActor *)0x0) {
        return 0;
      }
      pAVar1 = thing_00->inext;
    } while (thing_00->tid != arg0);
    while (thing = thing_00, pAVar1 != (AActor *)0x0) {
      while (thing_00 = pAVar1, thing_00->tid == arg0) {
        DoDeactivateThing(thing,it);
        pAVar1 = thing_00->inext;
        thing = thing_00;
        if (thing_00->inext == (AActor *)0x0) goto LAB_004061fb;
      }
      pAVar1 = thing_00->inext;
      thing_00 = thing;
    }
  }
LAB_004061fb:
  DoDeactivateThing(thing_00,it);
  return 1;
}

Assistant:

FUNC(LS_Thing_Deactivate)
// Thing_Deactivate (tid)
{
	if (arg0 != 0)
	{
		AActor *actor;
		FActorIterator iterator (arg0);
		int count = 0;
	
		actor = iterator.Next ();
		while (actor)
		{
			// Actor might removes itself as part of deactivation, so get next
			// one before we activate it.
			AActor *temp = iterator.Next ();
			DoDeactivateThing(actor, it);
			actor = temp;
			count++;
		}
	
		return count != 0;
	}
	else if (it != NULL)
	{
		DoDeactivateThing(it, it);
		return true;
	}
	return false;
}